

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

SurfaceInteraction * __thiscall phyr::Transform::operator()(Transform *this,SurfaceInteraction *si)

{
  long in_RDX;
  SurfaceInteraction *in_RSI;
  SurfaceInteraction *in_RDI;
  SurfaceInteraction *nsi;
  Transform *tr;
  SurfaceInteraction *n2;
  Normal3<double> *in_stack_fffffffffffffe20;
  Vector3<double> *in_stack_fffffffffffffe28;
  Transform *in_stack_fffffffffffffe30;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  Vector3<double> *in_stack_ffffffffffffff48;
  Vector3<double> *in_stack_ffffffffffffff50;
  Point3<double> *in_stack_ffffffffffffff58;
  Transform *in_stack_ffffffffffffff60;
  double local_98;
  double local_78;
  double local_70;
  double local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  n2 = in_RDI;
  SurfaceInteraction::SurfaceInteraction(in_RSI);
  operator()(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  (n2->super_Interaction).p.x = local_30;
  (n2->super_Interaction).p.y = local_28;
  (n2->super_Interaction).p.z = local_20;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  normalize<double>(in_stack_fffffffffffffe20);
  (n2->super_Interaction).n.x = local_48;
  (n2->super_Interaction).n.y = local_40;
  (n2->super_Interaction).n.z = local_38;
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  normalize<double>((Vector3<double> *)in_stack_fffffffffffffe20);
  (n2->super_Interaction).wo.x = local_78;
  (n2->super_Interaction).wo.y = local_70;
  (n2->super_Interaction).wo.z = local_68;
  (n2->uv).x = *(double *)(in_RDX + 0x60);
  (n2->uv).y = *(double *)(in_RDX + 0x68);
  n2->shape = *(Shape **)(in_RDX + 0xd8);
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->dpdu).x = (double)in_stack_ffffffffffffff58;
  (n2->dpdu).y = (double)in_stack_ffffffffffffff60;
  (n2->dpdu).z = local_98;
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->dpdv).x = local_c0;
  (n2->dpdv).y = (double)in_stack_ffffffffffffff48;
  (n2->dpdv).z = (double)in_stack_ffffffffffffff50;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  (n2->dndu).x = local_d8;
  (n2->dndu).y = local_d0;
  (n2->dndu).z = local_c8;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  (n2->dndv).x = local_f0;
  (n2->dndv).y = local_e8;
  (n2->dndv).z = local_e0;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  normalize<double>(in_stack_fffffffffffffe20);
  (n2->shadingGeom).n.x = local_108;
  (n2->shadingGeom).n.y = local_100;
  (n2->shadingGeom).n.z = local_f8;
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->shadingGeom).dpdu.x = local_138;
  (n2->shadingGeom).dpdu.y = local_130;
  (n2->shadingGeom).dpdu.z = local_128;
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->shadingGeom).dpdv.x = local_150;
  (n2->shadingGeom).dpdv.y = local_148;
  (n2->shadingGeom).dpdv.z = local_140;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  (n2->shadingGeom).dndu.x = local_168;
  (n2->shadingGeom).dndu.y = local_160;
  (n2->shadingGeom).dndu.z = local_158;
  operator()((Transform *)in_RSI,(Normal3<double> *)in_RDI);
  (n2->shadingGeom).dndv.x = local_180;
  (n2->shadingGeom).dndv.y = local_178;
  (n2->shadingGeom).dndv.z = local_170;
  n2->bsdf = *(BSDF **)(in_RDX + 0xd0);
  n2->object = *(Object **)(in_RDX + 0xe0);
  n2->dudx = *(double *)(in_RDX + 0x118);
  n2->dvdx = *(double *)(in_RDX + 0x120);
  n2->dudy = *(double *)(in_RDX + 0x128);
  n2->dvdy = *(double *)(in_RDX + 0x130);
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->dpdx).x = local_198;
  (n2->dpdx).y = local_190;
  (n2->dpdx).z = local_188;
  operator()(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  (n2->dpdy).x = local_1b0;
  (n2->dpdy).y = local_1a8;
  (n2->dpdy).z = local_1a0;
  (n2->shadingGeom).overridesOrientation = (bool)(*(byte *)(in_RDX + 0x1b0) & 1);
  if (((n2->shadingGeom).overridesOrientation & 1U) == 0) {
    faceForward<double>(in_stack_fffffffffffffe20,(Normal3<double> *)n2);
    (n2->shadingGeom).n.x = (double)in_stack_fffffffffffffe20;
    (n2->shadingGeom).n.y = (double)in_stack_fffffffffffffe28;
    (n2->shadingGeom).n.z = (double)in_stack_fffffffffffffe30;
  }
  else {
    faceForward<double>(in_stack_fffffffffffffe20,(Normal3<double> *)n2);
    (n2->super_Interaction).n.x = local_1c8;
    (n2->super_Interaction).n.y = local_1c0;
    (n2->super_Interaction).n.z = local_1b8;
  }
  return in_RDI;
}

Assistant:

SurfaceInteraction Transform::operator()(const SurfaceInteraction& si) const {
    SurfaceInteraction nsi;
    const Transform& tr = *this;

    // Interaction members
    nsi.p = tr(si.p, si.pfError, &nsi.pfError);
    nsi.n = normalize(tr(si.n)); nsi.wo = normalize(tr(si.wo));

    // SurfaceInteraction members
    nsi.uv = si.uv; nsi.shape = si.shape;
    nsi.dpdu = tr(si.dpdu); nsi.dpdv = tr(si.dpdv);
    nsi.dndu = tr(si.dndu); nsi.dndv = tr(si.dndv);
    // SurfaceInteraction::shadingGeometry members
    nsi.shadingGeom.n = normalize(tr(si.shadingGeom.n));
    nsi.shadingGeom.dpdu = tr(si.shadingGeom.dpdu);
    nsi.shadingGeom.dpdv = tr(si.shadingGeom.dpdv);
    nsi.shadingGeom.dndu = tr(si.shadingGeom.dndu);
    nsi.shadingGeom.dndv = tr(si.shadingGeom.dndv);

    nsi.bsdf = si.bsdf; nsi.object = si.object;
    nsi.dudx = si.dudx; nsi.dvdx = si.dvdx;
    nsi.dudy = si.dudy; nsi.dvdy = si.dvdy;
    nsi.dpdx = tr(si.dpdx); nsi.dpdy = tr(si.dpdy);

    // Check if normals should be readjusted
    nsi.shadingGeom.overridesOrientation = si.shadingGeom.overridesOrientation;
    if (nsi.shadingGeom.overridesOrientation)
        nsi.n = faceForward(nsi.n, nsi.shadingGeom.n);
    else
        nsi.shadingGeom.n = faceForward(nsi.shadingGeom.n, nsi.n);

    return nsi;
}